

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O0

void __thiscall vector_block<unsigned_long,_1024U>::clear(vector_block<unsigned_long,_1024U> *this)

{
  size_type sVar1;
  reference ppuVar2;
  ulong local_18;
  size_t i;
  vector_block<unsigned_long,_1024U> *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::size
                      (&this->_index_block);
    if (sVar1 <= local_18) break;
    ppuVar2 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
                        (&this->_index_block,local_18);
    free(*ppuVar2);
    local_18 = local_18 + 1;
  }
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::clear(&this->_index_block);
  this->_insertpos = (unsigned_long *)0x0;
  this->_left_in_block = 0;
  return;
}

Assistant:

void clear()
	{
		for (size_t i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
		_index_block.clear();
		_insertpos=0;
		_left_in_block=0;
	}